

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KcpWithTcpClient.cpp
# Opt level: O2

void __thiscall
sznet::net::KcpWithTcpClient::handleTcpMessage
          (KcpWithTcpClient *this,TcpConnectionPtr *tcpConn,string *message,Timestamp param_3)

{
  InetAddress *this_00;
  KcpConnectionPtr *this_01;
  EventLoop *loop;
  element_type *peVar1;
  InetAddress addr;
  uint16_t port;
  int32_t secretId;
  sz_sock fd;
  KcpConnection *pKVar2;
  self *this_02;
  SourceFile file;
  undefined1 local_10a8 [8];
  char buf [256];
  _Bind<void_(sznet::net::KcpWithTcpClient::*(sznet::net::KcpWithTcpClient_*,_std::_Placeholder<1>))(const_std::shared_ptr<sznet::net::KcpConnection>_&)>
  local_d8;
  undefined1 local_c0 [12];
  undefined1 local_b0 [8];
  Buffer recvBuf;
  undefined1 local_58 [8];
  string connName;
  
  EventLoop::assertInLoopThread(this->m_loop);
  if (message->_M_string_length == 10) {
    Buffer::Buffer((Buffer *)local_b0,4,0x400);
    Buffer::append((Buffer *)local_b0,(message->_M_dataplus)._M_p,message->_M_string_length);
    port = Buffer::readInt16((Buffer *)local_b0);
    connName.field_2._12_4_ = Buffer::readInt32((Buffer *)local_b0);
    secretId = Buffer::readInt32((Buffer *)local_b0);
    this_00 = &this->m_udpListenAddr;
    InetAddress::resetPort(this_00,port,false);
    InetAddress::toIpPort_abi_cxx11_((string *)local_58,this_00);
    snprintf(local_10a8,0x100,":kcp-%s#%d",local_58,
             (ulong)((tcpConn->
                     super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr)->m_id);
    std::__cxx11::string::~string((string *)local_58);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                   &this->m_name,local_10a8);
    pKVar2 = (KcpConnection *)operator_new(0x1f0);
    loop = this->m_loop;
    fd = sockets::sz_udp_create((uint)(this->m_udpListenAddr).field_0.m_addr.sin_family);
    KcpConnection::KcpConnection
              (pKVar2,loop,fd,secretId,(string *)local_58,connName.field_2._12_4_,true,
               this->m_kcpMode);
    this_01 = &this->m_kcpConnection;
    std::__shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>::
    reset<sznet::net::KcpConnection>
              (&this_01->super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>,
               pKVar2);
    pKVar2 = (this_01->super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    pKVar2->m_state = kConnecting;
    addr.field_0._12_4_ =
         (int)((ulong)*(undefined8 *)((long)&(this->m_udpListenAddr).field_0 + 8) >> 0x20);
    addr.field_0._0_12_ = *(undefined1 (*) [12])&this_00->field_0;
    addr.field_0._16_4_ =
         (int)((ulong)*(undefined8 *)((long)&(this->m_udpListenAddr).field_0 + 0xc) >> 0x20);
    addr.field_0._20_8_ = *(undefined8 *)((long)&(this->m_udpListenAddr).field_0 + 0x14);
    KcpConnection::setPeerAddr(pKVar2,addr);
    KcpConnection::newKCP
              ((this_01->super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr);
    std::function<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&)>::operator=
              (&((this->m_kcpConnection).
                 super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                m_kcpConnectionCallback,&this->m_kcpConnectionCallback);
    std::
    function<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&,_sznet::net::Buffer_*,_sznet::Timestamp)>
    ::operator=(&((this->m_kcpConnection).
                  super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                 ->m_kcpMessageCallback,&this->m_kcpMessageCallback);
    std::function<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&)>::operator=
              (&((this->m_kcpConnection).
                 super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                m_kcpWriteCompleteCallback,&this->m_kcpWriteCompleteCallback);
    peVar1 = (this->m_kcpConnection).
             super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_d8._M_f = (offset_in_KcpWithTcpClient_to_subr)removeKcpConnection;
    local_d8._8_8_ = 0;
    local_d8._M_bound_args.
    super__Tuple_impl<0UL,_sznet::net::KcpWithTcpClient_*,_std::_Placeholder<1>_>.
    super__Head_base<0UL,_sznet::net::KcpWithTcpClient_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_sznet::net::KcpWithTcpClient_*,_std::_Placeholder<1>_>)
         (_Tuple_impl<0UL,_sznet::net::KcpWithTcpClient_*,_std::_Placeholder<1>_>)this;
    std::function<void(std::shared_ptr<sznet::net::KcpConnection>const&,int)>::
    function<std::_Bind<void(sznet::net::KcpWithTcpClient::*(sznet::net::KcpWithTcpClient*,std::_Placeholder<1>))(std::shared_ptr<sznet::net::KcpConnection>const&)>,void>
              ((function<void(std::shared_ptr<sznet::net::KcpConnection>const&,int)> *)
               &recvBuf.m_wrapSize,&local_d8);
    std::function<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&,_int)>::operator=
              (&peVar1->m_kcpCloseCallback,
               (function<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&,_int)> *)
               &recvBuf.m_wrapSize);
    std::_Function_base::~_Function_base((_Function_base *)&recvBuf.m_wrapSize);
    KcpConnection::udpSendHandShakeVerify
              ((this_01->super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr);
    KcpConnection::udpSendHandShakeTimer
              ((this_01->super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr);
    std::__cxx11::string::~string((string *)local_58);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              ((_Vector_base<char,_std::allocator<char>_> *)&recvBuf);
  }
  else {
    Logger::SourceFile::SourceFile<107>
              ((SourceFile *)local_c0,
               (char (*) [107])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpWithTcpClient.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_c0._0_8_;
    file.m_size = local_c0._8_4_;
    Logger::Logger((Logger *)local_10a8,file,0xd4,ERROR);
    this_02 = LogStream::operator<<
                        ((LogStream *)buf,"KcpWithTcpClient::handleTcpMessage recv size error - ");
    LogStream::operator<<(this_02,message->_M_string_length);
    Logger::~Logger((Logger *)local_10a8);
  }
  return;
}

Assistant:

void KcpWithTcpClient::handleTcpMessage(const TcpConnectionPtr& tcpConn, const string& message, Timestamp)
{
	m_loop->assertInLoopThread();
	if (message.size() != (sizeof(uint16_t) + sizeof(int32_t) + sizeof(int32_t)))
	{
		LOG_ERROR << "KcpWithTcpClient::handleTcpMessage recv size error - " << message.size();
		return;
	}
	Buffer recvBuf;
	recvBuf.append(reinterpret_cast<const void*>(message.data()), message.size());
	// ����������Ϣ
	uint16_t udpListenPort = static_cast<uint16_t>(recvBuf.readInt16());
	uint32_t conv = static_cast<uint32_t>(recvBuf.readInt32());
	int secretId = recvBuf.readInt32();
	m_udpListenAddr.resetPort(udpListenPort);
	// ����KcpConnection
	char buf[256];
	snprintf(buf, sizeof(buf), ":kcp-%s#%d", m_udpListenAddr.toIpPort().c_str(), tcpConn->id());
	string connName = m_name + buf;
	m_kcpConnection.reset(new KcpConnection(m_loop, sockets::sz_udp_create(m_udpListenAddr.family()), secretId, connName, conv, true, m_kcpMode));
	m_kcpConnection->setState(KcpConnection::StateE::kConnecting);
	m_kcpConnection->setPeerAddr(m_udpListenAddr);
	m_kcpConnection->newKCP();
	m_kcpConnection->setKcpConnectionCallback(m_kcpConnectionCallback);
	m_kcpConnection->setKcpMessageCallback(m_kcpMessageCallback);
	m_kcpConnection->setKcpWriteCompleteCallback(m_kcpWriteCompleteCallback);
	m_kcpConnection->setKcpCloseCallback(std::bind(&KcpWithTcpClient::removeKcpConnection, this, std::placeholders::_1));
	m_kcpConnection->udpSendHandShakeVerify();
	m_kcpConnection->udpSendHandShakeTimer();
}